

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOSystem.hpp
# Opt level: O0

bool __thiscall Assimp::IOSystem::CreateDirectory(IOSystem *this,string *path)

{
  int iVar1;
  ulong uVar2;
  char *__path;
  string *path_local;
  IOSystem *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __path = (char *)std::__cxx11::string::c_str();
    iVar1 = mkdir(__path,0x1ff);
    this_local._7_1_ = iVar1 != 0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

AI_FORCE_INLINE
bool IOSystem::CreateDirectory( const std::string &path ) {
    if ( path.empty() ) {
        return false;
    }

#ifdef _WIN32
    return 0 != ::_mkdir( path.c_str() );
#else
    return 0 != ::mkdir( path.c_str(), 0777 );
#endif // _WIN32
}